

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * decTrim(decNumber *dn,decContext *set,uint8_t all,uint8_t noclamp,int32_t *dropped)

{
  int iVar1;
  int iVar2;
  uint units;
  uint uVar3;
  ulong uVar4;
  
  *dropped = 0;
  if (((dn->bits & 0x70) == 0) && ((dn->lsu[0] & 1) == 0)) {
    units = dn->digits;
    if (units == 1 && dn->lsu[0] == 0) {
      dn->exponent = 0;
    }
    else {
      uVar3 = 1;
      if (1 < (int)units) {
        uVar3 = units;
      }
      iVar2 = dn->exponent;
      for (uVar4 = 0; uVar3 - 1 != (int)uVar4; uVar4 = uVar4 + 1) {
        if (((dn->lsu[uVar4] >> 1) / 5) * -10 + (uint)dn->lsu[uVar4] != 0) goto LAB_0023f353;
        if (iVar2 < 1 && all == '\0') {
          if (iVar2 == 0) goto LAB_0023f353;
          iVar2 = iVar2 + 1;
        }
      }
      uVar4 = (ulong)(uVar3 - 1);
LAB_0023f353:
      iVar2 = (int)uVar4;
      if (iVar2 != 0) {
        if ((noclamp == '\0') && (set->clamp != '\0')) {
          iVar1 = (set->emax - (dn->exponent + set->digits)) + 1;
          if (iVar1 <= iVar2) {
            iVar2 = iVar1;
          }
          if (iVar1 < 1) {
            return dn;
          }
        }
        if ((int)units < 0x32) {
          units = (uint)""[(int)units];
        }
        decShiftToLeast(dn->lsu,units,iVar2);
        dn->exponent = dn->exponent + iVar2;
        dn->digits = dn->digits - iVar2;
        *dropped = iVar2;
      }
    }
  }
  return dn;
}

Assistant:

static decNumber * decTrim(decNumber *dn, decContext *set, Flag all,
                           Flag noclamp, Int *dropped) {
  Int   d, exp;                    /* work  */
  uInt  cut;                       /* ..  */
  Unit  *up;                       /* -> current Unit  */

  #if DECCHECK
  if (decCheckOperands(dn, DECUNUSED, DECUNUSED, DECUNCONT)) return dn;
  #endif

  *dropped=0;                           /* assume no zeros dropped  */
  if ((dn->bits & DECSPECIAL)           /* fast exit if special ..  */
    || (*dn->lsu & 0x01)) return dn;    /* .. or odd  */
  if (ISZERO(dn)) {                     /* .. or 0  */
    dn->exponent=0;                     /* (sign is preserved)  */
    return dn;
    }

  /* have a finite number which is even  */
  exp=dn->exponent;
  cut=1;                           /* digit (1-DECDPUN) in Unit  */
  up=dn->lsu;                      /* -> current Unit  */
  for (d=0; d<dn->digits-1; d++) { /* [don't strip the final digit]  */
    /* slice by powers  */
    #if DECDPUN<=4
      uInt quot=QUOT10(*up, cut);
      if ((*up-quot*powers[cut])!=0) break;  /* found non-0 digit  */
    #else
      if (*up%powers[cut]!=0) break;         /* found non-0 digit  */
    #endif
    /* have a trailing 0  */
    if (!all) {                    /* trimming  */
      /* [if exp>0 then all trailing 0s are significant for trim]  */
      if (exp<=0) {                /* if digit might be significant  */
        if (exp==0) break;         /* then quit  */
        exp++;                     /* next digit might be significant  */
        }
      }
    cut++;                         /* next power  */
    if (cut>DECDPUN) {             /* need new Unit  */
      up++;
      cut=1;
      }
    } /* d  */
  if (d==0) return dn;             /* none to drop  */

  /* may need to limit drop if clamping  */
  if (set->clamp && !noclamp) {
    Int maxd=set->emax-set->digits+1-dn->exponent;
    if (maxd<=0) return dn;        /* nothing possible  */
    if (d>maxd) d=maxd;
    }

  /* effect the drop  */
  decShiftToLeast(dn->lsu, D2U(dn->digits), d);
  dn->exponent+=d;                 /* maintain numerical value  */
  dn->digits-=d;                   /* new length  */
  *dropped=d;                      /* report the count  */
  return dn;
  }